

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clust2snp.cpp
# Opt level: O0

int dH(string *a,string *b)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  ulong in_RSI;
  ulong in_RDI;
  int i;
  int d;
  int len;
  undefined4 local_30;
  undefined4 local_1c;
  undefined4 local_18;
  
  uVar2 = std::__cxx11::string::size();
  uVar3 = std::__cxx11::string::size();
  if (uVar2 < uVar3) {
    local_30 = std::__cxx11::string::size();
  }
  else {
    local_30 = std::__cxx11::string::size();
  }
  local_18 = 0;
  for (local_1c = 0; local_1c < local_30; local_1c = local_1c + 1) {
    std::__cxx11::string::size();
    pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI);
    cVar1 = *pcVar4;
    std::__cxx11::string::size();
    pcVar4 = (char *)std::__cxx11::string::operator[](in_RSI);
    local_18 = (uint)(cVar1 != *pcVar4) + local_18;
  }
  return local_18;
}

Assistant:

int dH(string & a, string & b){

	int len = a.size() < b.size() ? a.size() : b.size();

	int d=0;

	for(int i=0;i<len;++i){

		d += a[a.size()-i-1]!=b[b.size()-i-1];

	}

	return d;

}